

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lj_trace.c
# Opt level: O2

void lj_trace_stitch(jit_State *J,BCIns *pc)

{
  if ((J->state == LJ_TRACE_IDLE) && ((J[-1].penalty[0x3c].pc.ptr32 & 0x6000) == 0)) {
    J->parent = 0;
    J->state = LJ_TRACE_START;
    lj_trace_ins(J,pc);
    return;
  }
  return;
}

Assistant:

void LJ_FASTCALL lj_trace_stitch(jit_State *J, const BCIns *pc)
{
  /* Only start a new trace if not recording or inside __gc call or vmevent. */
  if (J->state == LJ_TRACE_IDLE &&
      !(J2G(J)->hookmask & (HOOK_GC|HOOK_VMEVENT))) {
    J->parent = 0;  /* Have to treat it like a root trace. */
    /* J->exitno is set to the invoking trace. */
    J->state = LJ_TRACE_START;
    lj_trace_ins(J, pc);
  }
}